

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void cleanup_messages(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < histsize; local_c = local_c + 1) {
    if (msghistory[local_c].msg != (char *)0x0) {
      free(msghistory[local_c].msg);
    }
  }
  free(msghistory);
  prevturn = 0;
  msghistory = (message *)0x0;
  last_redraw_curline = 0;
  curline = 0;
  start_of_turn_curline = -1;
  histpos = 0;
  histsize = 0;
  for (local_c = 0; local_c < 0x28; local_c = local_c + 1) {
    msglines[local_c][0] = '\0';
  }
  return;
}

Assistant:

void cleanup_messages(void)
{
    int i;

    for (i = 0; i < histsize; i++) {
	if (msghistory[i].msg)
	    free(msghistory[i].msg);
    }
    free(msghistory);
    prevturn = 0;

    /* extra cleanup to prevent old messages from appearing in a new game */
    msghistory = NULL;
    curline = last_redraw_curline = 0;
    start_of_turn_curline = -1;
    histsize = histpos = 0;
    for (i = 0; i < MAX_MSGLINES; i++)
	msglines[i][0] = '\0';
}